

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

void __thiscall MPEGPictureHeader::setVbvDelay(MPEGPictureHeader *this,uint16_t val)

{
  uint8_t *puVar1;
  byte *pbVar2;
  uint8_t *vbv_delay_ptr;
  uint16_t val_local;
  MPEGPictureHeader *this_local;
  
  if (((this->super_MPEGRawDataHeader).m_headerIncludedToBuff & 1U) == 0) {
    this->vbv_delay = val;
  }
  else {
    puVar1 = (this->super_MPEGRawDataHeader).m_data_buffer;
    pbVar2 = puVar1 + 5;
    *pbVar2 = *pbVar2 & 0xf8;
    *pbVar2 = *pbVar2 | (byte)((int)(uint)this->vbv_delay >> 0xd);
    puVar1[6] = (uint8_t)((int)(uint)this->vbv_delay >> 5);
    puVar1[7] = puVar1[7] & 7;
    puVar1[7] = puVar1[7] | (char)this->vbv_delay << 3;
  }
  return;
}

Assistant:

void MPEGPictureHeader::setVbvDelay(const uint16_t val)
{
    if (m_headerIncludedToBuff)
    {
        uint8_t* vbv_delay_ptr = &m_data_buffer[5];  // skip sequence header and 1-st byte of ref
        vbv_delay_ptr[0] &= 0xF8;
        vbv_delay_ptr[0] |= vbv_delay >> 13;
        vbv_delay_ptr[1] = static_cast<uint8_t>(vbv_delay >> 5);
        vbv_delay_ptr[2] &= 0x07;
        vbv_delay_ptr[2] |= vbv_delay << 3;
    }
    else
        vbv_delay = val;
}